

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O2

void test_cpp_wrapper_range
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int min_key,int max_key)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  Dictionary<int,_int> *dict_00;
  int *expected_records;
  int min_key_00;
  ion_boolean_t *piVar4;
  int iVar5;
  int iVar6;
  int key;
  undefined8 uStack_70;
  ion_boolean_t aiStack_68 [8];
  undefined8 uStack_60;
  int aiStack_58 [2];
  ulong local_50;
  Dictionary<int,_int> *local_48;
  int *local_40;
  int local_34;
  
  local_48 = dict;
  local_34 = min_key;
  local_50 = (ulong)((max_key - min_key) + 1);
  lVar2 = -(local_50 * 4 + 0xf & 0xfffffffffffffff0);
  local_40 = (int *)((long)aiStack_58 + lVar2);
  *(undefined8 *)((long)&uStack_60 + lVar2) = 0xfffffffffffffffb;
  iVar5 = (int)*(undefined8 *)((long)&uStack_60 + lVar2);
  if (-5 < max_key) {
    iVar5 = max_key;
  }
  iVar6 = 0;
  for (key = 0; min_key_00 = local_34, expected_records = local_40, dict_00 = local_48,
      uVar3 = local_50, iVar5 + 5 != key; key = key + 1) {
    *(undefined8 *)((long)&uStack_60 + lVar2) = 1;
    uVar1 = *(undefined8 *)((long)&uStack_60 + lVar2);
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x10a7a8;
    cpp_wrapper_insert(tc,dict_00,key,key,(ion_boolean_t)uVar1);
    if (key <= max_key && local_34 <= key) {
      local_40[iVar6] = key;
      iVar6 = iVar6 + 1;
    }
  }
  piVar4 = aiStack_68 + lVar2;
  piVar4[0] = '\x01';
  piVar4[1] = '\0';
  piVar4[2] = '\0';
  piVar4[3] = '\0';
  piVar4[4] = '\0';
  piVar4[5] = '\0';
  piVar4[6] = '\0';
  piVar4[7] = '\0';
  *(undefined8 *)((long)&uStack_70 + lVar2) = 0x10a7eb;
  cpp_wrapper_range(tc,dict_00,min_key_00,max_key,expected_records,(int)uVar3,aiStack_68[lVar2]);
  return;
}

Assistant:

void
test_cpp_wrapper_range(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int min_key,
	int max_key
) {
	/* records_expected is calculated the following way because it is min_key and max_key inclusive. */
	int records_expected	= max_key - min_key + 1;
	int curr_pos			= 0;
	int nums[records_expected];

	for (int i = 0; i < max_key + 5; i++) {
		cpp_wrapper_insert(tc, dict, i, i, boolean_true);

		if ((i >= min_key) && (i <= max_key)) {
			nums[curr_pos] = i;
			curr_pos++;
		}
	}

	cpp_wrapper_range(tc, dict, min_key, max_key, nums, records_expected, boolean_true);
}